

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::FreeBuffer(CopyingInputStreamAdaptor *this)

{
  uchar *puVar1;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (this->backup_bytes_ != 0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x12e);
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: (backup_bytes_) == (0): ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  this->buffer_used_ = 0;
  puVar1 = (this->buffer_).array_;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
    (this->buffer_).array_ = (uchar *)0x0;
  }
  return;
}

Assistant:

void CopyingInputStreamAdaptor::FreeBuffer() {
  GOOGLE_CHECK_EQ(backup_bytes_, 0);
  buffer_used_ = 0;
  buffer_.reset();
}